

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O3

void __thiscall cppnet::BaseLogger::SetLevel(BaseLogger *this,LogLevel level)

{
  _Elt_pointer ppLVar1;
  _Elt_pointer ppLVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  undefined4 extraout_var;
  ushort uVar7;
  uint16_t uVar8;
  void *del;
  Log *log;
  Log *local_48;
  unique_lock<std::mutex> local_40;
  
  uVar8 = (uint16_t)level;
  this->_level = uVar8;
  if (uVar8 != 0) {
    local_40._M_owns = false;
    local_40._M_device = &(this->_cache_queue)._mutex;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    ppLVar1 = (this->_cache_queue)._queue.c.
              super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    ppLVar2 = (this->_cache_queue)._queue.c.
              super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    if (ppLVar1 == ppLVar2) {
      if (this->_cache_size == 0) {
        return;
      }
      uVar7 = 0;
      do {
        peVar3 = (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar5 = (*peVar3->_vptr_Alloter[3])(peVar3,(ulong)(this->_block_size + 0x10));
        local_40._M_device = (mutex_type *)CONCAT44(extraout_var,iVar5);
        (((ThreadSafeQueue<cppnet::Log_*> *)local_40._M_device)->_mutex).super___mutex_base._M_mutex
        .__align = (long)((long)&(((ThreadSafeQueue<cppnet::Log_*> *)local_40._M_device)->_mutex).
                                 super___mutex_base._M_mutex + 0x10);
        *(uint *)((long)&(((ThreadSafeQueue<cppnet::Log_*> *)local_40._M_device)->_mutex).
                         super___mutex_base._M_mutex + 8) = (uint)this->_block_size;
        ThreadSafeQueue<cppnet::Log_*>::Push(&this->_cache_queue,(Log **)&local_40);
        uVar7 = uVar7 + 1;
      } while (uVar7 < this->_cache_size);
      return;
    }
    uVar8 = this->_level;
  }
  if (uVar8 == 0) {
    sVar6 = ThreadSafeQueue<cppnet::Log_*>::Size(&this->_cache_queue);
    local_40._M_device = (mutex_type *)0x0;
    local_48 = (Log *)0x0;
    if (sVar6 != 0) {
      do {
        bVar4 = ThreadSafeQueue<cppnet::Log_*>::Pop(&this->_cache_queue,(Log **)&local_40);
        if (bVar4) {
          local_48 = (Log *)local_40._M_device;
          peVar3 = (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar3->_vptr_Alloter[5])(peVar3,&local_48,0);
        }
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
    }
  }
  return;
}

Assistant:

void BaseLogger::SetLevel(LogLevel level) { 
    _level = level; 
    if (_level > LL_NULL && _cache_queue.Empty()) {
        for (uint16_t i = 0; i < _cache_size; i++) {
            _cache_queue.Push(NewLog());
        }

    } else if (_level == LL_NULL) {
        size_t size = _cache_queue.Size();
        Log* log = nullptr;
        void* del = nullptr;
        for (size_t i = 0; i < size; i++) {
            if (_cache_queue.Pop(log)) {
                del = (void*)log;
                _allocter->Free(del);
            }
        }
    }
}